

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::emit_select_instruction(Impl *impl,SelectInst *instruction)

{
  uint32_t uVar1;
  bool bVar2;
  Predicate PVar3;
  Id arg;
  BinaryOps BVar4;
  uint uVar5;
  ulong in_RAX;
  Value *pVVar6;
  Value *value;
  Value *value_00;
  CmpInst *this;
  CallInst *this_00;
  Constant *this_01;
  APInt *this_02;
  int64_t iVar7;
  Operation *op;
  Type *pTVar8;
  BinaryOperator *this_03;
  CallInst *pCVar9;
  uint i;
  uint index;
  uint32_t const_val_1;
  uint32_t const_val;
  
  index = 0;
  _const_val_1 = in_RAX;
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  value_00 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  this = LLVMBC::dyn_cast<LLVMBC::CmpInst>(pVVar6);
  if ((this != (CmpInst *)0x0) && (PVar3 = LLVMBC::CmpInst::getPredicate(this), PVar3 == ICMP_EQ)) {
    pVVar6 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
    bVar2 = value_is_dx_op_instrinsic(pVVar6,FirstbitHi);
    if (!bVar2) {
      pVVar6 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
      bVar2 = value_is_dx_op_instrinsic(pVVar6,FirstbitSHi);
      if (!bVar2) goto LAB_0014a7ec;
    }
    _const_val_1 = _const_val_1 & 0xffffffff;
    bVar2 = get_constant_operand(&this->super_Instruction,1,&const_val);
    if ((bVar2) && (const_val == 0xffffffff)) {
      pVVar6 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
      this_00 = LLVMBC::cast<LLVMBC::CallInst>(pVVar6);
      this_01 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
      if (this_01 != (Constant *)0x0) {
        this_02 = LLVMBC::Constant::getUniqueInteger(this_01);
        iVar7 = LLVMBC::APInt::getSExtValue(this_02);
        if ((((iVar7 == -1) &&
             (this_03 = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(value_00),
             this_03 != (BinaryOperator *)0x0)) &&
            (BVar4 = LLVMBC::BinaryOperator::getOpcode(this_03), BVar4 == Sub)) &&
           (pCVar9 = (CallInst *)LLVMBC::Instruction::getOperand(&this_03->super_Instruction,1),
           pCVar9 == this_00)) {
          _const_val_1 = _const_val_1 & 0xffffffff00000000;
          bVar2 = get_constant_operand(&this_03->super_Instruction,0,&const_val_1);
          if (bVar2) {
            uVar1 = const_val_1;
            pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
            pTVar8 = LLVMBC::Value::getType(pVVar6);
            uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar8);
            if (uVar1 == uVar5 - 1) {
              bVar2 = value_is_dx_op_instrinsic((Value *)this_00,FirstbitHi);
              pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
              emit_native_bitscan(bVar2 | GLSLstd450FindSMsb,impl,&instruction->super_Instruction,
                                  pVVar6);
              return true;
            }
          }
        }
      }
    }
  }
LAB_0014a7ec:
  op = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
  for (; index != 3; index = index + 1) {
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
    arg = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(op,arg);
  }
  Converter::Impl::add(impl,op,false);
  pTVar8 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar8,op->id,false);
  return true;
}

Assistant:

bool emit_select_instruction(Converter::Impl &impl, const llvm::SelectInst *instruction)
{
	if (emit_peephole_findmsb(impl, instruction))
		return true;

	Operation *op = impl.allocate(spv::OpSelect, instruction);

	for (unsigned i = 0; i < 3; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}